

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void invalid_get_byoffset_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t bodylen;
  ssize_t sVar4;
  uint uVar5;
  fdb_config *fconfig;
  fdb_doc **ppfVar6;
  char *pcVar7;
  fdb_doc **unaff_R12;
  list *plVar8;
  fdb_doc **unaff_R13;
  ulong uVar9;
  char *unaff_R14;
  fdb_doc **unaff_R15;
  long lVar10;
  fdb_doc *local_13c8 [7];
  undefined8 uStack_1390;
  fdb_doc *local_1378;
  uint8_t buf [4096];
  fdb_config local_370;
  undefined1 local_278 [8];
  char bodybuf [256];
  char keybuf [256];
  timeval __test_begin;
  undefined1 local_48 [8];
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  
  ppfVar6 = &local_1378;
  gettimeofday((timeval *)(keybuf + 0xf8),(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fconfig = &local_370;
  fdb_get_default_config();
  local_370.purging_interval = 1;
  local_370.seqtree_opt = '\x01';
  fdb_get_default_kvs_config();
  fVar1 = fdb_open((fdb_file_handle **)local_48,"./dummy1",fconfig);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open((fdb_file_handle *)local_48,(fdb_kvs_handle **)&rdoc,(char *)0x0,
                         (fdb_kvs_config *)&__test_begin.tv_usec);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2c4;
    fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
    fconfig = (fdb_config *)(bodybuf + 0xf8);
    builtin_strncpy(bodybuf + 0xf8,"key",4);
    unaff_R14 = local_278;
    local_278._0_4_ = 0x79646f62;
    local_278._4_2_ = local_278._4_2_ & 0xff00;
    unaff_R15 = (fdb_doc **)strlen((char *)fconfig);
    sVar3 = strlen(unaff_R14);
    unaff_R12 = (fdb_doc **)&dbfile;
    uStack_1390 = 0x119d83;
    fdb_doc_create(unaff_R12,fconfig,(size_t)unaff_R15,(void *)0x0,0,unaff_R14,sVar3);
    fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2c9;
    fdb_kvs_close((fdb_kvs_handle *)rdoc);
    fconfig = (fdb_config *)local_48;
    fdb_close((fdb_file_handle *)local_48);
    fVar1 = fdb_open((fdb_file_handle **)fconfig,"./dummy1",&local_370);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2ce;
    fVar1 = fdb_kvs_open((fdb_file_handle *)local_48,(fdb_kvs_handle **)&rdoc,(char *)0x0,
                         (fdb_kvs_config *)&__test_begin.tv_usec);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2d3;
    fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
    fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a2d8;
    fconfig = (fdb_config *)&dbfile;
    fdb_doc_free((fdb_doc *)dbfile);
    unaff_R14 = bodybuf + 0xf8;
    unaff_R15 = (fdb_doc **)strlen(unaff_R14);
    unaff_R12 = (fdb_doc **)local_278;
    sVar3 = strlen((char *)unaff_R12);
    uStack_1390 = 0x119e5a;
    fdb_doc_create((fdb_doc **)fconfig,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R12,sVar3);
    fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2dd;
    ppfVar6 = local_13c8;
    lVar10 = -10;
    unaff_R13 = ppfVar6;
    do {
      uVar5 = (int)lVar10 + 0xb;
      sprintf(unaff_R14,"key%d",(ulong)uVar5);
      sprintf((char *)unaff_R12,"val%d",(ulong)uVar5);
      sVar3 = strlen(unaff_R14);
      bodylen = strlen((char *)unaff_R12);
      fdb_doc_create(unaff_R13,unaff_R14,sVar3,(void *)0x0,0,unaff_R12,bodylen);
      fdb_set((fdb_kvs_handle *)rdoc,*unaff_R13);
      unaff_R13 = unaff_R13 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
    fconfig = (fdb_config *)0x48e7894cfffe91f2;
    fVar1 = fdb_commit((fdb_file_handle *)local_48,'\x01');
    unaff_R15 = ppfVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2e2;
    lVar10 = 0;
    do {
      fdb_doc_free(ppfVar6[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    dbfile[1].handles = (list *)0x48e7894cfffe91f2;
    fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    unaff_R14 = (char *)0xa;
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a2e7;
    fconfig = (fdb_config *)&dbfile;
    fdb_doc_free((fdb_doc *)dbfile);
    unaff_R14 = bodybuf + 0xf8;
    unaff_R15 = (fdb_doc **)strlen(unaff_R14);
    unaff_R12 = (fdb_doc **)local_278;
    sVar3 = strlen((char *)unaff_R12);
    fdb_doc_create((fdb_doc **)fconfig,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R12,sVar3);
    fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2ec;
    fVar1 = fdb_del((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2f1;
    fdb_doc_free((fdb_doc *)dbfile);
    builtin_strncpy(bodybuf + 0xf8,"key0",5);
    unaff_R15 = (fdb_doc **)local_278;
    local_278._0_4_ = 0x79646f62;
    local_278._4_2_ = 0x30;
    unaff_R12 = (fdb_doc **)strlen(unaff_R14);
    sVar3 = strlen((char *)unaff_R15);
    fdb_doc_create((fdb_doc **)fconfig,unaff_R14,(size_t)unaff_R12,(void *)0x0,0,unaff_R15,sVar3);
    fVar1 = fdb_set((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2f6;
    fVar1 = fdb_commit((fdb_file_handle *)local_48,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a2fb;
    fconfig = (fdb_config *)local_48;
    unaff_R14 = "./dummy2";
    fdb_compact((fdb_file_handle *)local_48,"./dummy2");
    fdb_kvs_close((fdb_kvs_handle *)rdoc);
    fdb_close((fdb_file_handle *)local_48);
    fVar1 = fdb_open((fdb_file_handle **)fconfig,"./dummy2",&local_370);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a300;
    fVar1 = fdb_kvs_open((fdb_file_handle *)local_48,(fdb_kvs_handle **)&rdoc,(char *)0x0,
                         (fdb_kvs_config *)&__test_begin.tv_usec);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a305;
    fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
    fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_READ_FAIL) goto LAB_0011a30a;
    unaff_R14 = (char *)fopen("./dummy2","r");
    fconfig = (fdb_config *)0xfffffffffffff000;
    unaff_R12 = (fdb_doc **)0x1000;
    unaff_R15 = &local_1378;
    do {
      fconfig = (fdb_config *)((long)fconfig + 0x1000);
      iVar2 = fileno((FILE *)unaff_R14);
      sVar4 = pread(iVar2,unaff_R15,0x1000,(__off_t)fconfig);
      if (sVar4 != 0x1000) break;
    } while (buf[0xff7] != 0xff);
    fclose((FILE *)unaff_R14);
    dbfile[1].handles = (list *)fconfig;
    fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 != FDB_RESULT_READ_FAIL) goto LAB_0011a30f;
    iVar2 = rand();
    dbfile[1].handles = (list *)((long)fconfig + (long)(iVar2 % 0x1000));
    fVar1 = fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
    if (fVar1 == FDB_RESULT_READ_FAIL) {
      fdb_doc_free((fdb_doc *)dbfile);
      fdb_begin_transaction((fdb_file_handle *)local_48,'\x02');
      uVar9 = 0;
      do {
        sprintf(bodybuf + 0xf8,"k%06d",uVar9 & 0xffffffff);
        sprintf(local_278,"v%06d",uVar9 & 0xffffffff);
        fdb_set_kv((fdb_kvs_handle *)rdoc,bodybuf + 0xf8,8,local_278,8);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 100);
      fdb_end_transaction((fdb_file_handle *)local_48,'\0');
      plVar8 = (list *)0x0;
      do {
        sprintf(bodybuf + 0xf8,"k%06d",(ulong)plVar8 & 0xffffffff);
        fdb_doc_create((fdb_doc **)&dbfile,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        dbfile[1].handles = plVar8;
        fdb_get_byoffset((fdb_kvs_handle *)rdoc,(fdb_doc *)dbfile);
        fdb_doc_free((fdb_doc *)dbfile);
        plVar8 = (list *)((long)&plVar8->head + 1);
      } while (plVar8 != (list *)0x186a0);
      fdb_kvs_close((fdb_kvs_handle *)rdoc);
      fdb_close((fdb_file_handle *)local_48);
      fdb_shutdown();
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (invalid_get_byoffset_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar7,"invalid get by-offset test");
      return;
    }
  }
  else {
    invalid_get_byoffset_test();
LAB_0011a2c4:
    invalid_get_byoffset_test();
LAB_0011a2c9:
    invalid_get_byoffset_test();
LAB_0011a2ce:
    invalid_get_byoffset_test();
LAB_0011a2d3:
    invalid_get_byoffset_test();
LAB_0011a2d8:
    invalid_get_byoffset_test();
LAB_0011a2dd:
    invalid_get_byoffset_test();
LAB_0011a2e2:
    ppfVar6[-1] = (fdb_doc *)0x11a2e7;
    invalid_get_byoffset_test();
LAB_0011a2e7:
    ppfVar6[-1] = (fdb_doc *)0x11a2ec;
    invalid_get_byoffset_test();
LAB_0011a2ec:
    ppfVar6[-1] = (fdb_doc *)0x11a2f1;
    invalid_get_byoffset_test();
LAB_0011a2f1:
    ppfVar6[-1] = (fdb_doc *)0x11a2f6;
    invalid_get_byoffset_test();
LAB_0011a2f6:
    ppfVar6[-1] = (fdb_doc *)0x11a2fb;
    invalid_get_byoffset_test();
LAB_0011a2fb:
    ppfVar6[-1] = (fdb_doc *)0x11a300;
    invalid_get_byoffset_test();
LAB_0011a300:
    ppfVar6[-1] = (fdb_doc *)0x11a305;
    invalid_get_byoffset_test();
LAB_0011a305:
    ppfVar6[-1] = (fdb_doc *)0x11a30a;
    invalid_get_byoffset_test();
LAB_0011a30a:
    ppfVar6[-1] = (fdb_doc *)0x11a30f;
    invalid_get_byoffset_test();
LAB_0011a30f:
    ppfVar6[-1] = (fdb_doc *)0x11a314;
    invalid_get_byoffset_test();
  }
  ppfVar6[-1] = (fdb_doc *)dirty_index_consistency_test;
  invalid_get_byoffset_test();
  ppfVar6[-1] = (fdb_doc *)&stack0xfffffffffffffff8;
  ppfVar6[-2] = (fdb_doc *)unaff_R15;
  ppfVar6[-3] = (fdb_doc *)unaff_R14;
  ppfVar6[-4] = (fdb_doc *)unaff_R13;
  ppfVar6[-5] = (fdb_doc *)unaff_R12;
  ppfVar6[-6] = (fdb_doc *)fconfig;
  ppfVar6[-0x72] = (fdb_doc *)0x11a336;
  gettimeofday((timeval *)(ppfVar6 + -0x67),(__timezone_ptr_t)0x0);
  ppfVar6[-0x72] = (fdb_doc *)0x11a33b;
  memleak_start();
  ppfVar6[-0x72] = (fdb_doc *)0x11a347;
  system("rm -rf  dummy* > errorlog.txt");
  pcVar7 = (char *)(ppfVar6 + -0x25);
  ppfVar6[-0x72] = (fdb_doc *)0x11a357;
  fdb_get_default_config();
  ppfVar6[-0x24] = (fdb_doc *)0x0;
  ppfVar6[-0x23] = (fdb_doc *)0x64;
  ppfVar6[-0x72] = (fdb_doc *)0x11a371;
  fdb_get_default_kvs_config();
  ppfVar6[-0x72] = (fdb_doc *)0x11a385;
  fVar1 = fdb_open((fdb_file_handle **)(ppfVar6 + -0x6f),"dummy",(fdb_config *)pcVar7);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a672;
  ppfVar6[-0x72] = (fdb_doc *)0x11a3a3;
  fVar1 = fdb_kvs_open((fdb_file_handle *)ppfVar6[-0x6f],(fdb_kvs_handle **)(ppfVar6 + -0x6d),
                       (char *)0x0,(fdb_kvs_config *)(ppfVar6 + -0x6a));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a677;
  ppfVar6[-0x72] = (fdb_doc *)0x11a3c1;
  fVar1 = fdb_kvs_open((fdb_file_handle *)ppfVar6[-0x6f],(fdb_kvs_handle **)(ppfVar6 + -0x6c),
                       (char *)0x0,(fdb_kvs_config *)(ppfVar6 + -0x6a));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a67c;
  pcVar7 = (char *)(ppfVar6 + -0x45);
  ppfVar6[-0x72] = (fdb_doc *)0x11a3e0;
  memset(pcVar7,0,0x100);
  unaff_R14 = (char *)(ppfVar6 + -0x65);
  ppfVar6[-0x72] = (fdb_doc *)0x11a3f4;
  memset(unaff_R14,0,0x100);
  uVar9 = 0;
  do {
    ppfVar6[-0x72] = (fdb_doc *)0x11a418;
    sprintf(pcVar7,"k%06d",uVar9);
    ppfVar6[-0x72] = (fdb_doc *)0x11a427;
    sprintf(unaff_R14,"v%06d",uVar9);
    ppfVar6[-0x71] = (fdb_doc *)0x9;
    ppfVar6[-0x72] = (fdb_doc *)0x11a447;
    fdb_doc_create(ppfVar6 + -0x70,pcVar7,8,(void *)0x0,0,unaff_R14,(size_t)ppfVar6[-0x71]);
    ppfVar6[-0x72] = (fdb_doc *)0x11a456;
    fVar1 = fdb_set((fdb_kvs_handle *)ppfVar6[-0x6c],ppfVar6[-0x70]);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      ppfVar6[-0x72] = (fdb_doc *)0x11a668;
      dirty_index_consistency_test();
      goto LAB_0011a668;
    }
    ppfVar6[-0x72] = (fdb_doc *)0x11a468;
    fdb_doc_free(ppfVar6[-0x70]);
    uVar5 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcVar7 = "k%06d";
  unaff_R14 = (char *)(ppfVar6 + -0x45);
  uVar5 = 0;
  do {
    ppfVar6[-0x72] = (fdb_doc *)0x11a49c;
    sprintf(unaff_R14,"k%06d",(ulong)uVar5);
    ppfVar6[-0x71] = (fdb_doc *)0x9;
    ppfVar6[-0x72] = (fdb_doc *)0x11a4bc;
    fdb_doc_create(ppfVar6 + -0x70,unaff_R14,8,(void *)0x0,0,ppfVar6 + -0x65,(size_t)ppfVar6[-0x71])
    ;
    ppfVar6[-0x72] = (fdb_doc *)0x11a4cb;
    fVar1 = fdb_get((fdb_kvs_handle *)ppfVar6[-0x6d],ppfVar6[-0x70]);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a668;
    ppfVar6[-0x72] = (fdb_doc *)0x11a4dd;
    fdb_doc_free(ppfVar6[-0x70]);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 1000);
  pcVar7 = (char *)0x3e8;
  unaff_R14 = "k%06d";
  do {
    ppfVar6[-0x72] = (fdb_doc *)0x11a51b;
    sprintf((char *)(ppfVar6 + -0x45),"k%06d",pcVar7);
    ppfVar6[-0x72] = (fdb_doc *)0x11a52a;
    sprintf((char *)(ppfVar6 + -0x65),"v%06d",pcVar7);
    ppfVar6[-0x71] = (fdb_doc *)0x9;
    ppfVar6[-0x72] = (fdb_doc *)0x11a54a;
    fdb_doc_create(ppfVar6 + -0x70,ppfVar6 + -0x45,8,(void *)0x0,0,ppfVar6 + -0x65,
                   (size_t)ppfVar6[-0x71]);
    ppfVar6[-0x72] = (fdb_doc *)0x11a559;
    fVar1 = fdb_set((fdb_kvs_handle *)ppfVar6[-0x6c],ppfVar6[-0x70]);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a66d;
    ppfVar6[-0x72] = (fdb_doc *)0x11a56b;
    fdb_doc_free(ppfVar6[-0x70]);
    uVar5 = (int)pcVar7 + 1;
    pcVar7 = (char *)(ulong)uVar5;
  } while (uVar5 != 3000);
  ppfVar6[-0x72] = (fdb_doc *)0x11a584;
  fVar1 = fdb_commit((fdb_file_handle *)ppfVar6[-0x6f],'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a681;
  *(undefined4 *)(ppfVar6 + -0x71) = 0;
  unaff_R14 = (char *)0x0;
  ppfVar6[-0x72] = (fdb_doc *)0x11a5af;
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)ppfVar6[-0x6c],(fdb_iterator **)(ppfVar6 + -0x6e),
                            (void *)0x0,0,(void *)0x0,0,*(fdb_iterator_opt_t *)(ppfVar6 + -0x71));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011a686;
  pcVar7 = (char *)(ppfVar6 + -0x6b);
  do {
    ppfVar6[-0x6b] = (fdb_doc *)0x0;
    ppfVar6[-0x72] = (fdb_doc *)0x11a5d2;
    fVar1 = fdb_iterator_get((fdb_iterator *)ppfVar6[-0x6e],(fdb_doc **)pcVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    unaff_R14 = (char *)(ulong)((int)unaff_R14 + 1);
    ppfVar6[-0x72] = (fdb_doc *)0x11a5e3;
    fdb_doc_free(ppfVar6[-0x6b]);
    ppfVar6[-0x72] = (fdb_doc *)0x11a5ed;
    fVar1 = fdb_iterator_next((fdb_iterator *)ppfVar6[-0x6e]);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  ppfVar6[-0x72] = (fdb_doc *)0x11a5fb;
  fdb_iterator_close((fdb_iterator *)ppfVar6[-0x6e]);
  if ((int)unaff_R14 == 3000) {
    ppfVar6[-0x72] = (fdb_doc *)0x11a612;
    fVar1 = fdb_close((fdb_file_handle *)ppfVar6[-0x6f]);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      ppfVar6[-0x72] = (fdb_doc *)0x11a61b;
      fdb_shutdown();
      ppfVar6[-0x72] = (fdb_doc *)0x11a620;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (dirty_index_consistency_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      ppfVar6[-0x72] = (fdb_doc *)0x11a651;
      fprintf(_stderr,pcVar7,"dirty index consistency test");
      return;
    }
    goto LAB_0011a690;
  }
  goto LAB_0011a68b;
LAB_0011a668:
  ppfVar6[-0x72] = (fdb_doc *)0x11a66d;
  dirty_index_consistency_test();
LAB_0011a66d:
  ppfVar6[-0x72] = (fdb_doc *)0x11a672;
  dirty_index_consistency_test();
LAB_0011a672:
  ppfVar6[-0x72] = (fdb_doc *)0x11a677;
  dirty_index_consistency_test();
LAB_0011a677:
  ppfVar6[-0x72] = (fdb_doc *)0x11a67c;
  dirty_index_consistency_test();
LAB_0011a67c:
  ppfVar6[-0x72] = (fdb_doc *)0x11a681;
  dirty_index_consistency_test();
LAB_0011a681:
  ppfVar6[-0x72] = (fdb_doc *)0x11a686;
  dirty_index_consistency_test();
LAB_0011a686:
  ppfVar6[-0x72] = (fdb_doc *)0x11a68b;
  dirty_index_consistency_test();
LAB_0011a68b:
  ppfVar6[-0x72] = (fdb_doc *)0x11a690;
  dirty_index_consistency_test();
LAB_0011a690:
  ppfVar6[-0x72] = (fdb_doc *)apis_with_invalid_handles_test;
  dirty_index_consistency_test();
  ppfVar6[-0x72] = (fdb_doc *)unaff_R14;
  ppfVar6[-0x73] = (fdb_doc *)pcVar7;
  ppfVar6[-0xab] = (fdb_doc *)0x11a6b1;
  gettimeofday((timeval *)(ppfVar6 + -0x99),(__timezone_ptr_t)0x0);
  ppfVar6[-0xa3] = (fdb_doc *)0x0;
  ppfVar6[-0xa4] = (fdb_doc *)0x0;
  ppfVar6[-0xa2] = (fdb_doc *)0x0;
  ppfVar6[-0xab] = (fdb_doc *)0x11a6c8;
  memleak_start();
  ppfVar6[-0xab] = (fdb_doc *)0x11a6d4;
  system("rm -rf  dummy* > errorlog.txt");
  ppfVar6[-0xab] = (fdb_doc *)0x11a6e4;
  fdb_get_default_config();
  ppfVar6[-0xab] = (fdb_doc *)0x11a6ee;
  fdb_get_default_kvs_config();
  ppfVar6[-0xab] = (fdb_doc *)0x11a700;
  fVar1 = fdb_open((fdb_file_handle **)(ppfVar6 + -0xa3),"dummy",(fdb_config *)(ppfVar6 + -0x92));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a716;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a72c;
  fVar1 = fdb_kvs_open((fdb_file_handle *)ppfVar6[-0xa3],(fdb_kvs_handle **)(ppfVar6 + -0xa4),
                       (char *)0x0,(fdb_kvs_config *)(ppfVar6 + -0xa1));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a744;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a757;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)ppfVar6[-0xa4],(fdb_kvs_handle **)0x0,
                            0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a766;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a776;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)0x0,(fdb_kvs_handle **)0x0,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a780;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a78f;
  fVar1 = fdb_rollback((fdb_kvs_handle **)(ppfVar6 + -0xa2),10);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a79e;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a7ae;
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)0x0,logCallbackFunc,(void *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a7b8;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a7c1;
  fVar1 = fdb_get_byoffset((fdb_kvs_handle *)0x0,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a7cb;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a7d4;
  fVar1 = fdb_set((fdb_kvs_handle *)0x0,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a7de;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a7e7;
  fVar1 = fdb_del((fdb_kvs_handle *)0x0,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a7f1;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a7fa;
  fVar1 = fdb_commit((fdb_file_handle *)0x0,'\0');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a804;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a80d;
  fVar1 = fdb_compact((fdb_file_handle *)0x0,(char *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a817;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a820;
  fVar1 = fdb_compact_with_cow((fdb_file_handle *)0x0,(char *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a82a;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0x9c] = (fdb_doc *)0x0;
  ppfVar6[-0x9b] = (fdb_doc *)0x0;
  ppfVar6[-0x9e] = (fdb_doc *)0x0;
  ppfVar6[-0x9d] = (fdb_doc *)0x0;
  *(undefined4 *)(ppfVar6 + -0x9a) = 0;
  *(undefined4 *)(ppfVar6 + -0xa6) = *(undefined4 *)(ppfVar6 + -0x9a);
  ppfVar6[-0xa8] = ppfVar6[-0x9c];
  ppfVar6[-0xa7] = ppfVar6[-0x9b];
  ppfVar6[-0xaa] = (fdb_doc *)0x0;
  ppfVar6[-0xa9] = (fdb_doc *)0x0;
  ppfVar6[-0xab] = (fdb_doc *)0x11a862;
  fVar1 = fdb_rekey((fdb_file_handle *)0x0,*(fdb_encryption_key *)(ppfVar6 + -0xaa));
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a874;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a889;
  fVar1 = fdb_iterator_seek((fdb_iterator *)0x0,"key",3,'\0');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a893;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a89a;
  fVar1 = fdb_iterator_seek_to_min((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a8a4;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a8ab;
  fVar1 = fdb_iterator_seek_to_max((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a8b5;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a8bc;
  fVar1 = fdb_iterator_prev((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a8c6;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a8cd;
  fVar1 = fdb_iterator_next((fdb_iterator *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a8d7;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a8e0;
  fVar1 = fdb_iterator_get((fdb_iterator *)0x0,(fdb_doc **)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a8ea;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a8f3;
  fVar1 = fdb_iterator_get_metaonly((fdb_iterator *)0x0,(fdb_doc **)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a8fd;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a90d;
  fVar1 = fdb_kvs_open((fdb_file_handle *)0x0,(fdb_kvs_handle **)0x0,(char *)0x0,
                       (fdb_kvs_config *)(ppfVar6 + -0xa1));
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a91c;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a923;
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a92d;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a939;
  fVar1 = fdb_begin_transaction((fdb_file_handle *)0x0,'\x02');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a943;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a94a;
  fVar1 = fdb_abort_transaction((fdb_file_handle *)0x0);
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a954;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a95d;
  fVar1 = fdb_end_transaction((fdb_file_handle *)0x0,'\0');
  if (fVar1 != FDB_RESULT_INVALID_HANDLE) {
    ppfVar6[-0xab] = (fdb_doc *)0x11a967;
    apis_with_invalid_handles_test();
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a971;
  fdb_kvs_close((fdb_kvs_handle *)ppfVar6[-0xa4]);
  ppfVar6[-0xab] = (fdb_doc *)0x11a97b;
  fdb_close((fdb_file_handle *)ppfVar6[-0xa3]);
  ppfVar6[-0xab] = (fdb_doc *)0x11a980;
  fdb_shutdown();
  ppfVar6[-0xab] = (fdb_doc *)0x11a985;
  memleak_end();
  pcVar7 = "%s PASSED\n";
  if (apis_with_invalid_handles_test()::__test_pass != '\0') {
    pcVar7 = "%s FAILED\n";
  }
  ppfVar6[-0xab] = (fdb_doc *)0x11a9b6;
  fprintf(_stderr,pcVar7,"apis with invalid handles test");
  return;
}

Assistant:

void invalid_get_byoffset_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    fconfig.purging_interval = 1;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

    sprintf(keybuf, "key");
    sprintf(bodybuf, "body");

    /* Scenario 1: Fetch offset from empty file */

    {
        // Create a doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // close db file
        fdb_kvs_close(db);
        fdb_close(dbfile);

        // open new dbfile
        status = fdb_open(&dbfile, "./dummy1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

        // attempt to get key by previous offset,
        // should fail as doc wasn't commited
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

        fdb_doc_free(rdoc);
    }

    /* Scenario 2: Fetch invalid offset that points to a different data block
       from same file */

    {
        // Create a doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Write 10 additional documents
        fdb_doc **doc = alca(fdb_doc*, 10);
        int i;
        for (i = 0; i < 10; ++i) {
            sprintf(keybuf, "key%d", i+1);
            sprintf(bodybuf, "val%d", i+1);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                           NULL, 0, (void*)bodybuf, strlen(bodybuf));
            fdb_set(db, doc[i]);
        }
        uint64_t last_offset = doc[i-1]->offset;

        // Commit the doc so it goes into main index
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Free all the additional documents
        for (i = 0; i < 10; ++i) {
            fdb_doc_free(doc[i]);
        }

        // Incorrectly set rdoc's offset to the last saved doc's offset
        rdoc->offset = last_offset;

        // attempt to get key by incorrect offset belonging to a different
        // data block
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

        fdb_doc_free(rdoc);
    }

    /* Scenario 3: Fetch old offset from compacted file */

    {
        // Create doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Delete the doc
        status = fdb_del(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_doc_free(rdoc);
        sprintf(keybuf, "key0");
        sprintf(bodybuf, "body0");

        // Create doc again
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                       NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Commit the doc so it goes into main index
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Compact file
        fdb_compact(dbfile, "./dummy2");

        // close db file
        fdb_kvs_close(db);
        fdb_close(dbfile);

        // open new dbfile
        status = fdb_open(&dbfile, "./dummy2", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

        // attempt to get key by incorrect offset belonging to different file
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);
    }

    /* Scenario 4: Fetch invalid offset that points to an index block
       on same file */

    {
        uint8_t buf[4096];
        FILE* fd = fopen("./dummy2", "r");
        int64_t offset = 0;
#if !defined(WIN32) && !defined(_WIN32)
        while (pread(fileno(fd), buf, 4096, offset) == 4096) {
            if (buf[4095] == BLK_MARKER_BNODE) {
                // This means this block was an index block
                // (last byte of the block is 0xff)
                break;
            }
            offset += 4096;
        }
        fclose(fd);
#else
        DWORD bytesread;
        OVERLAPPED winoffs;
        memset(&winoffs, 0, sizeof(winoffs));
        winoffs.Offset = offset & 0xFFFFFFFF;
        winoffs.OffsetHigh = ((uint64_t)offset >> 32) & 0x7FFFFFFF;
        while (ReadFile(fd, buf, 4096, &bytesread, &winoffs)) {
            if (buf[4095] == BLK_MARKER_BNODE) {
                // This means this block was an index block
                // (last byte of the block is 0xff)
                break;
            }
            offset += 4096;
            winoffs.Offset = offset & 0xFFFFFFFF;
            winoffs.OffsetHigh = ((uint64_t)offset >> 32) & 0x7FFFFFFF;
        }
        fclose(fd);
#endif

        // Set doc's offset to that of the index block
        rdoc->offset = offset;

        // attempt to get key by incorrect offset belonging to an index block
        // (offset points to start of an index block)
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);

        // Set doc's offset to a random spot within that index block
        rdoc->offset = offset + (rand() % 4096);

        // attempt to get key by incorrect offset belonging to an index block
        // (offset points to somewhere within the index block)
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);

        // Free the document
        fdb_doc_free(rdoc);
    }

    /* Scenario 5: Fetch invalid offset that points to a transaction commit marker
       on same file */
    {
        size_t i;

        // insert 100 docs using transaction
        fdb_begin_transaction(dbfile, FDB_ISOLATION_READ_COMMITTED);
        for (i=0;i<100;++i) {
            sprintf(keybuf, "k%06d", (int)i);
            sprintf(bodybuf, "v%06d", (int)i);
            fdb_set_kv(db, keybuf, 8, bodybuf, 8);
        }
        fdb_end_transaction(dbfile, FDB_COMMIT_NORMAL);

        // try to retrieve all possible offsets
        for (i=0;i<100000;++i) {
            sprintf(keybuf, "k%06d", (int)i);
            fdb_doc_create(&rdoc, NULL, 0 , NULL, 0, NULL, 0);
            rdoc->offset = i;
            fdb_get_byoffset(db, rdoc);
            fdb_doc_free(rdoc);
        }
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("invalid get by-offset test");
}